

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

QList<unsigned_long_long> * __thiscall
QMultiHash<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>::keys
          (QMultiHash<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo> *this)

{
  long lVar1;
  key_iterator i1;
  QList<unsigned_long_long> *in_RDI;
  long in_FS_OFFSET;
  piter in_stack_00000040;
  undefined1 in_stack_00000058 [24];
  QMultiHash<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo> *in_stack_ffffffffffffff90;
  QList<unsigned_long_long> *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  keyBegin(in_stack_ffffffffffffff90);
  keyEnd(in_stack_ffffffffffffff90);
  i1.i.e = (Chain **)this;
  i1.i.i = in_stack_00000040;
  QList<unsigned_long_long>::
  QList<QMultiHash<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>::key_iterator,_true>
            (this_00,i1,(key_iterator)in_stack_00000058);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QList<Key> keys() const { return QList<Key>(keyBegin(), keyEnd()); }